

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O1

void __thiscall siamese::Decoder::Decoder(Decoder *this)

{
  LightVector<siamese::RecoveryMatrixState::RowInfo,_25U> *pLVar1;
  LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U> *pLVar2;
  CheckedRegionState *pCVar3;
  undefined8 *puVar4;
  ulong uVar5;
  DecoderColumnLane *pDVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  
  pktalloc::Allocator::Allocator(&this->TheAllocator);
  *(undefined8 *)((long)&(this->CheckedRegion).LastRecovery + 5) = 0;
  *(undefined8 *)((long)&(this->CheckedRegion).RecoveryCount + 1) = 0;
  (this->CheckedRegion).FirstRecovery = (RecoveryPacket *)0x0;
  (this->CheckedRegion).LastRecovery = (RecoveryPacket *)0x0;
  auVar16 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->RecoveryPackets).TheAllocator = (Allocator *)auVar16._0_8_;
  (this->RecoveryPackets).CheckedRegion = (CheckedRegionState *)auVar16._8_8_;
  (this->RecoveryPackets).Head = (RecoveryPacket *)auVar16._16_8_;
  (this->RecoveryPackets).Tail = (RecoveryPacket *)auVar16._24_8_;
  (this->RecoveryPackets).RecoveryPacketCount = 0;
  (this->Window).Subwindows.Size = 0;
  (this->Stats).Counts[0] = 0;
  (this->Stats).Counts[1] = 0;
  (this->Stats).Counts[2] = 0;
  (this->Stats).Counts[3] = 0;
  (this->Stats).Counts[4] = 0;
  (this->Stats).Counts[5] = 0;
  (this->Stats).Counts[6] = 0;
  (this->Stats).Counts[7] = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x24) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x2c) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x34) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x3c) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x44) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x4c) = 0;
  *(undefined8 *)((long)(this->Stats).Counts + 0x54) = 0;
  *(undefined8 *)((long)&(this->CheckedRegion).RecoveryMatrix + 4) = 0;
  *(undefined1 (*) [32])&(this->RecoveryPackets).LastRecoveryBytes = auVar16;
  *(undefined1 (*) [32])((long)&(this->Window).CheckedRegion + 4) = ZEXT1632(ZEXT816(0) << 0x40);
  (this->Window).Subwindows.Allocated = 0x19;
  (this->Window).Subwindows.DataPtr = (this->Window).Subwindows.PreallocatedData;
  pDVar6 = (this->Window).Lanes;
  lVar7 = 0x118;
  do {
    lVar8 = -0x48;
    do {
      puVar4 = (undefined8 *)((long)&pDVar6[1].Sums[0].ElementStart + lVar8);
      *puVar4 = 0;
      puVar4[1] = 0;
      *(undefined4 *)((long)&pDVar6[1].Sums[0].Buffer.Bytes + lVar8) = 0;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0);
    lVar7 = lVar7 + 0x48;
    pDVar6 = pDVar6 + 1;
  } while (lVar7 != 0x358);
  lVar7 = 0;
  (this->Window).SumColumnStart = 0;
  (this->Window).SumColumnCount = 0;
  (this->Window).RecoveredPackets.Size = 0;
  (this->Window).RecoveredPackets.Allocated = 0x19;
  (this->Window).RecoveredPackets.DataPtr = (this->Window).RecoveredPackets.PreallocatedData;
  (this->Window).HasRecoveredPackets = false;
  (this->Window).RecoveredColumns.Size = 0;
  (this->Window).RecoveredColumns.Allocated = 0x19;
  (this->Window).RecoveredColumns.DataPtr = (this->Window).RecoveredColumns.PreallocatedData;
  (this->Window).SubwindowsShift.Size = 0;
  (this->Window).SubwindowsShift.Allocated = 0x19;
  (this->Window).SubwindowsShift.DataPtr = (this->Window).SubwindowsShift.PreallocatedData;
  (this->Window).EmergencyDisabled = false;
  pLVar1 = &(this->RecoveryMatrix).Rows;
  (this->RecoveryMatrix).TheAllocator = (Allocator *)SUB168(ZEXT416(0) << 0x40,0);
  (this->RecoveryMatrix).Window = (DecoderPacketWindow *)SUB168(ZEXT416(0) << 0x40,8);
  (this->RecoveryMatrix).CheckedRegion = (CheckedRegionState *)0x0;
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x7060504030201000));
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0x19));
  auVar13 = vpbroadcastq_avx512f();
  auVar14 = vpbroadcastq_avx512f(ZEXT816(0x80));
  do {
    auVar15 = vpbroadcastq_avx512f();
    auVar15 = vporq_avx512f(auVar15,auVar11);
    uVar5 = vpcmpuq_avx512f(auVar15,auVar12,1);
    auVar15 = vpaddq_avx512f(auVar13,auVar10);
    vpscatterqq_avx512f(ZEXT864(pLVar1) + auVar10,uVar5,ZEXT1664((undefined1  [16])0x0));
    if ((uVar5 & 1) != 0) {
      *(undefined1 *)(auVar15._0_8_ + 8) = 0;
    }
    if ((uVar5 & 2) != 0) {
      lVar8 = vpextrq_avx(auVar15._0_16_,1);
      *(undefined1 *)(lVar8 + 8) = 0;
    }
    if ((uVar5 & 4) != 0) {
      *(undefined1 *)(auVar15._16_8_ + 8) = 0;
    }
    if ((uVar5 & 8) != 0) {
      lVar8 = vpextrq_avx(auVar15._16_16_,1);
      *(undefined1 *)(lVar8 + 8) = 0;
    }
    auVar9 = vextracti32x4_avx512f(auVar15,2);
    if ((uVar5 & 0x10) != 0) {
      *(undefined1 *)(auVar9._0_8_ + 8) = 0;
    }
    if ((uVar5 & 0x20) != 0) {
      lVar8 = vpextrq_avx(auVar9,1);
      *(undefined1 *)(lVar8 + 8) = 0;
    }
    auVar9 = vextracti32x4_avx512f(auVar15,3);
    if ((uVar5 & 0x40) != 0) {
      *(undefined1 *)(auVar9._0_8_ + 8) = 0;
    }
    if ((uVar5 & 0x80) != 0) {
      lVar8 = vpextrq_avx(auVar9,1);
      *(undefined1 *)(lVar8 + 8) = 0;
    }
    vpscatterqd_avx512f(ZEXT832(0xc) + auVar15._0_32_,uVar5,
                        SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    lVar7 = lVar7 + 8;
    auVar10 = vpaddq_avx512f(auVar10,auVar14);
  } while (lVar7 != 0x20);
  (this->RecoveryMatrix).Rows.Size = 0;
  (this->RecoveryMatrix).Rows.Allocated = 0x19;
  (this->RecoveryMatrix).Rows.DataPtr = pLVar1->PreallocatedData;
  pLVar2 = &(this->RecoveryMatrix).Columns;
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x7060504030201000));
  lVar7 = 0;
  auVar13 = vpbroadcastq_avx512f();
  do {
    auVar15 = vpbroadcastq_avx512f();
    auVar15 = vporq_avx512f(auVar15,auVar11);
    uVar5 = vpcmpuq_avx512f(auVar15,auVar12,1);
    auVar15 = vpaddq_avx512f(auVar13,auVar10);
    vpscatterqq_avx512f(ZEXT864(pLVar2) + auVar10,uVar5,ZEXT1664((undefined1  [16])0x0));
    vpscatterqd_avx512f(ZEXT832(8) + auVar15._0_32_,uVar5,SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                       );
    if ((uVar5 & 1) != 0) {
      *(undefined1 *)(auVar15._0_8_ + 0xc) = 0;
    }
    if ((uVar5 & 2) != 0) {
      lVar8 = vpextrq_avx(auVar15._0_16_,1);
      *(undefined1 *)(lVar8 + 0xc) = 0;
    }
    if ((uVar5 & 4) != 0) {
      *(undefined1 *)(auVar15._16_8_ + 0xc) = 0;
    }
    if ((uVar5 & 8) != 0) {
      lVar8 = vpextrq_avx(auVar15._16_16_,1);
      *(undefined1 *)(lVar8 + 0xc) = 0;
    }
    auVar9 = vextracti32x4_avx512f(auVar15,2);
    if ((uVar5 & 0x10) != 0) {
      *(undefined1 *)(auVar9._0_8_ + 0xc) = 0;
    }
    if ((uVar5 & 0x20) != 0) {
      lVar8 = vpextrq_avx(auVar9,1);
      *(undefined1 *)(lVar8 + 0xc) = 0;
    }
    auVar9 = vextracti32x4_avx512f(auVar15,3);
    if ((uVar5 & 0x40) != 0) {
      *(undefined1 *)(auVar9._0_8_ + 0xc) = 0;
    }
    if ((uVar5 & 0x80) != 0) {
      lVar8 = vpextrq_avx(auVar9,1);
      *(undefined1 *)(lVar8 + 0xc) = 0;
    }
    lVar7 = lVar7 + 8;
    auVar10 = vpaddq_avx512f(auVar10,auVar14);
  } while (lVar7 != 0x20);
  pCVar3 = &this->CheckedRegion;
  (this->RecoveryMatrix).Columns.Size = 0;
  (this->RecoveryMatrix).Columns.Allocated = 0x19;
  (this->RecoveryMatrix).Columns.DataPtr = pLVar2->PreallocatedData;
  (this->RecoveryMatrix).PreviousNextCheckStart = 0;
  (this->RecoveryMatrix).Matrix.Data = (uint8_t *)0x0;
  (this->RecoveryMatrix).Matrix.Rows = 0;
  (this->RecoveryMatrix).Matrix.Columns = 0;
  (this->RecoveryMatrix).Matrix.AllocatedRows = 0;
  (this->RecoveryMatrix).Matrix.AllocatedColumns = 0;
  (this->RecoveryMatrix).Pivots.Size = 0;
  (this->RecoveryMatrix).Pivots.Allocated = 0x19;
  (this->RecoveryMatrix).Pivots.DataPtr = (this->RecoveryMatrix).Pivots.PreallocatedData;
  (this->RecoveryMatrix).GEResumePivot = 0;
  (this->ProductSum).Data = (uint8_t *)0x0;
  (this->ProductSum).Bytes = 0;
  this->LatestColumn = 0;
  (this->RecoveryPackets).TheAllocator = &this->TheAllocator;
  (this->RecoveryPackets).CheckedRegion = pCVar3;
  (this->Window).TheAllocator = &this->TheAllocator;
  (this->Window).Stats = &this->Stats;
  (this->Window).CheckedRegion = pCVar3;
  (this->Window).RecoveryPackets = &this->RecoveryPackets;
  (this->Window).RecoveryMatrix = &this->RecoveryMatrix;
  (this->RecoveryMatrix).TheAllocator = &this->TheAllocator;
  (this->RecoveryMatrix).Window = &this->Window;
  (this->RecoveryMatrix).CheckedRegion = pCVar3;
  (this->CheckedRegion).RecoveryMatrix = &this->RecoveryMatrix;
  return;
}

Assistant:

Decoder::Decoder()
{
    RecoveryPackets.TheAllocator  = &TheAllocator;
    RecoveryPackets.CheckedRegion = &CheckedRegion;
    Window.TheAllocator           = &TheAllocator;
    Window.Stats                  = &Stats;
    Window.CheckedRegion          = &CheckedRegion;
    Window.RecoveryPackets        = &RecoveryPackets;
    Window.RecoveryMatrix         = &RecoveryMatrix;
    RecoveryMatrix.TheAllocator   = &TheAllocator;
    RecoveryMatrix.Window         = &Window;
    RecoveryMatrix.CheckedRegion  = &CheckedRegion;
    CheckedRegion.RecoveryMatrix  = &RecoveryMatrix;
}